

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
ObjectTest_basic_map_access_operator_Test::~ObjectTest_basic_map_access_operator_Test
          (ObjectTest_basic_map_access_operator_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_map_access_operator) {
	object obj;

	obj[u8"test"] = 1234;
	EXPECT_EQ(obj[u8"test"].get<int>(), 1234);
	EXPECT_EQ(obj[u8"test2"].get<int>(), 0);

	obj[u8"test"] = 4567;
	EXPECT_EQ(obj[u8"test"].get<int>(), 4567);
	EXPECT_EQ(obj[u8"test2"].get<int>(), 0);

	obj[u8"test2"] = 1234;
	EXPECT_EQ(obj[u8"test"].get<int>(), 4567);
	EXPECT_EQ(obj[u8"test2"].get<int>(), 1234);
}